

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadDoubleArray
          (CrateReader *this,bool is_compressed,vector<double,_std::allocator<double>_> *d)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  uint64_t uVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pdVar8;
  long lVar9;
  char *pcVar10;
  pointer puVar11;
  size_t nbytes;
  size_t sVar12;
  size_t sz;
  uint32_t shapesize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint32_t n;
  uint local_1cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  vector<double,_std::allocator<double>_> local_1a8 [4];
  ios_base local_138 [264];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar4 = StreamReader::read4(this->_sr,&local_1cc);
    if (!bVar4) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadDoubleArray",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x28f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar10 = "Failed to read the number of array elements.";
      lVar9 = 0x2c;
      goto LAB_001aeee7;
    }
    bVar4 = StreamReader::read4(this->_sr,(uint32_t *)local_1a8);
    if (!bVar4) goto LAB_001aee3c;
    pdVar8 = (pointer)((ulong)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffff);
  }
  else {
    bVar4 = StreamReader::read8(this->_sr,(uint64_t *)local_1a8);
    pdVar8 = local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (!bVar4) goto LAB_001aee3c;
  }
  if (pdVar8 == (pointer)0x0) {
    pdVar8 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish != pdVar8) {
      (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar8;
      return true;
    }
    return true;
  }
  if ((pointer)(this->_config).maxArrayElements < pdVar8) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadDoubleArray",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x2a8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar10 = "Too many array elements.";
    lVar9 = 0x18;
LAB_001aeee7:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append
              ((char *)&this->_err,
               (ulong)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    if ((pointer *)
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    return false;
  }
  uVar7 = (long)pdVar8 * 8;
  uVar6 = this->_memoryUsage + uVar7;
  this->_memoryUsage = uVar6;
  if ((this->_config).maxMemoryBudget < uVar6) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadDoubleArray",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x2ab);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar10 = "Reached to max memory budget.";
    lVar9 = 0x1d;
    goto LAB_001aeee7;
  }
  ::std::vector<double,_std::allocator<double>_>::resize(d,(size_type)pdVar8);
  if (is_compressed) {
    ::std::vector<double,_std::allocator<double>_>::resize(d,(size_type)pdVar8);
    pSVar2 = this->_sr;
    uVar6 = pSVar2->length_;
    uVar3 = pSVar2->idx_;
    if ((pointer)0xf < pdVar8) {
      if (uVar3 + 1 <= uVar6) {
        uVar1 = pSVar2->binary_[uVar3];
        pSVar2->idx_ = uVar3 + 1;
        if (uVar1 == 't') {
          bVar4 = StreamReader::read4(pSVar2,&local_1cc);
          if (bVar4) {
            local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<double,_std::allocator<double>_>::resize(local_1a8,(ulong)local_1cc);
            pSVar2 = this->_sr;
            uVar3 = pSVar2->idx_;
            uVar7 = (ulong)local_1cc << 3;
            sVar12 = pSVar2->length_ - uVar3;
            if (uVar3 + (ulong)local_1cc * 8 <= pSVar2->length_) {
              sVar12 = uVar7;
            }
            if (uVar7 <= sVar12 - 1) {
              ::std::__cxx11::string::append((char *)&this->_err);
              if (local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) {
                return false;
              }
              operator_delete(local_1a8[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              return false;
            }
            memcpy(local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,sVar12);
            pSVar2->idx_ = pSVar2->idx_ + sVar12;
            local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (uint *)0x0;
            local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (uint *)0x0;
            local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&local_1c8,(size_type)pdVar8);
            bVar4 = ReadCompressedInts<unsigned_int>
                              (this,local_1c8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                               (long)local_1c8.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1c8.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2);
            if (bVar4) {
              if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pdVar8 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                puVar11 = local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  *pdVar8 = local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start[*puVar11];
                  pdVar8 = pdVar8 + 1;
                  puVar11 = puVar11 + 1;
                } while (puVar11 !=
                         local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
              }
            }
            else {
              ::std::__cxx11::string::append((char *)&this->_err);
            }
            if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
              operator_delete(local_1c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1c8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1c8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
LAB_001af37a:
            if (local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1a8[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar4 == false) {
              return false;
            }
            return true;
          }
        }
        else if (uVar1 == 'i') {
          local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)local_1a8,(size_type)pdVar8);
          bVar4 = ReadCompressedInts<int>
                            (this,(int *)local_1a8[0].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start,
                             (long)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
          if (bVar4) {
            lVar9 = (long)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_1a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2;
            if (0 < lVar9) {
              pdVar8 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar7 = lVar9 + 1;
              lVar9 = 0;
              do {
                *(double *)((long)pdVar8 + lVar9 * 2) =
                     (double)*(int *)((long)local_1a8[0].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar9);
                uVar7 = uVar7 - 1;
                lVar9 = lVar9 + 4;
              } while (1 < uVar7);
            }
          }
          else {
            ::std::__cxx11::string::append((char *)&this->_err);
          }
          goto LAB_001af37a;
        }
      }
      goto LAB_001aee3c;
    }
    sVar12 = uVar6 - uVar3;
    if (uVar3 + uVar7 <= uVar6) {
      sVar12 = uVar7;
    }
  }
  else {
    pSVar2 = this->_sr;
    uVar3 = pSVar2->idx_;
    sVar12 = pSVar2->length_ - uVar3;
    if (uVar3 + uVar7 <= pSVar2->length_) {
      sVar12 = uVar7;
    }
  }
  if (sVar12 - 1 < uVar7) {
    memcpy((d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start,pSVar2->binary_ + uVar3,sVar12);
    pSVar2->idx_ = pSVar2->idx_ + sVar12;
    return true;
  }
LAB_001aee3c:
  ::std::__cxx11::string::append((char *)&this->_err);
  return false;
}

Assistant:

bool CrateReader::ReadDoubleArray(bool is_compressed, std::vector<double> *d) {

  size_t length;
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }

    length = size_t(n);
  }

  if (length == 0) {
    d->clear();
    return true;
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(length * sizeof(double));

  d->resize(length);

  if (!is_compressed) {

    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(double) * length, sizeof(double) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      _err += "Failed to read double array data.\n";
      return false;
    }

    return true;
  } else {

    //
    // compressed data is represented by integers or look-up table.
    //

    d->resize(length);

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(double) * length;
      // Not stored in compressed.
      // reader.ReadContiguous(odata, osize);
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        _err += "Failed to read uncompressed array data.\n";
        return false;
      }
      return true;
    }

    // Read the code
    char code;
    if (!_sr->read1(&code)) {
      _err += "Failed to read the code.\n";
      return false;
    }

    if (code == 'i') {
      // Compressed integers.
      std::vector<int32_t> ints;
      ints.resize(length);
      if (!ReadCompressedInts(ints.data(), ints.size())) {
        _err += "Failed to read compressed ints in ReadDoubleArray.\n";
        return false;
      }
      std::copy(ints.begin(), ints.end(), d->data());
    } else if (code == 't') {
      // Lookup table & indexes.
      uint32_t lutSize;
      if (!_sr->read4(&lutSize)) {
        _err += "Failed to read lutSize in ReadDoubleArray.\n";
        return false;
      }

      std::vector<double> lut;
      lut.resize(lutSize);
      if (!_sr->read(sizeof(double) * lutSize, sizeof(double) * lutSize,
                     reinterpret_cast<uint8_t *>(lut.data()))) {
        _err += "Failed to read lut table in ReadDoubleArray.\n";
        return false;
      }

      std::vector<uint32_t> indexes;
      indexes.resize(length);
      if (!ReadCompressedInts(indexes.data(), indexes.size())) {
        _err += "Failed to read lut indices in ReadDoubleArray.\n";
        return false;
      }

      auto o = d->data();
      for (auto index : indexes) {
        *o++ = lut[index];
      }
    } else {
      _err += "Invalid code. Data is currupted\n";
      return false;
    }

    return true;
  }
}